

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O1

void h265e_dpb_set_ref_list(H265eDpb *dpb,H265eSlice *slice,RK_S32 delta_poc)

{
  H265eRefPicListModification *__s;
  bool bVar1;
  long lVar2;
  char *fmt;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  __s = (dpb->RpsList).m_RefPicListModification;
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","enter\n","h265e_dpb_set_ref_list");
  }
  memset(__s,0,0x88);
  __s->m_refPicListModificationFlagL0 = 0;
  if (1 < (slice->m_localRPS).m_numberOfPictures) {
    if ((slice->m_localRPS).m_numberOfPictures < 1) {
      iVar3 = -1;
      bVar1 = true;
    }
    else {
      uVar4 = 0xffffffff;
      uVar7 = 0;
      iVar8 = 0;
      iVar6 = 0;
      do {
        if (((byte)h265e_debug & 0x80) != 0) {
          _mpp_log_l(4,"h265e_dpb","m_pRps->delta_poc[%d] = %d",(char *)0x0,uVar7 & 0xffffffff,
                     (ulong)(uint)(slice->m_localRPS).delta_poc[uVar7]);
        }
        if ((slice->m_localRPS).delta_poc[uVar7] == delta_poc) {
          lVar2 = (long)(~(slice->m_localRPS).num_long_term_pic +
                        (slice->m_localRPS).m_numberOfPictures);
          iVar6 = iVar6 + (uint)((long)uVar7 <= lVar2);
          iVar8 = iVar8 + (uint)(lVar2 < (long)uVar7);
          if (((byte)h265e_debug & 0x80) != 0) {
            pcVar5 = "lt";
            if (iVar6 != 0) {
              pcVar5 = "st";
            }
            _mpp_log_l(4,"h265e_dpb","get %s ref ref_idx %d delta_poc %d",(char *)0x0,pcVar5,
                       uVar7 & 0xffffffff,delta_poc);
          }
          uVar4 = uVar7 & 0xffffffff;
        }
        iVar3 = (int)uVar4;
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)(slice->m_localRPS).m_numberOfPictures);
      bVar1 = iVar6 == 0 && iVar8 != 1;
    }
    if (bVar1) {
      fmt = "Warning: Did not find the right long term reference picture or more than one.";
      iVar3 = 2;
      pcVar5 = (char *)0x0;
      goto LAB_001cba4c;
    }
    if (iVar3 != 0) {
      __s->m_refPicListModificationFlagL0 = 1;
      calc_ref_pic_set_idxl0(dpb,slice,iVar3);
    }
  }
  __s->m_refPicListModificationFlagL1 = 0;
  if (((byte)h265e_debug & 1) == 0) {
    return;
  }
  fmt = "leave\n";
  pcVar5 = "h265e_dpb_set_ref_list";
  iVar3 = 4;
LAB_001cba4c:
  _mpp_log_l(iVar3,"h265e_dpb",fmt,pcVar5);
  return;
}

Assistant:

void h265e_dpb_set_ref_list(H265eDpb *dpb, H265eSlice *slice, RK_S32 delta_poc)
{
    RK_S32 i;
    RK_S32 ref_idx = -1;
    RK_S32 lt_cnt = 0, st_cnt = 0;
    H265eRpsList *RpsList = &dpb->RpsList;
    H265eReferencePictureSet * m_pRps = (H265eReferencePictureSet*)&slice->m_localRPS;
    H265eRefPicListModification* refPicListModification = RpsList->m_RefPicListModification;

    h265e_dbg_func("enter\n");
    refPicListModification->m_refPicListModificationFlagL0 = 0;
    refPicListModification->m_refPicListModificationFlagL1 = 0;

    for (i = 0; i < REF_PIC_LIST_NUM_IDX; i ++) {
        refPicListModification->m_RefPicSetIdxL0[i] = 0;
        refPicListModification->m_RefPicSetIdxL0[i] = 0;
    }

    refPicListModification->m_refPicListModificationFlagL0 = 0;

    if (m_pRps->m_numberOfPictures > 1) {
        for (i = 0; i < m_pRps->m_numberOfPictures; i++) {
            h265e_dbg_dpb("m_pRps->delta_poc[%d] = %d", i, m_pRps->delta_poc[i]);
            if (m_pRps->delta_poc[i] == delta_poc) {
                ref_idx = i;
                if (i > m_pRps->m_numberOfPictures - m_pRps->num_long_term_pic - 1)
                    lt_cnt++;
                else
                    st_cnt++;
                h265e_dbg_dpb("get %s ref ref_idx %d delta_poc %d", st_cnt ? "st" : "lt", ref_idx, delta_poc);
            }
        }
        if (lt_cnt != 1 && st_cnt == 0) {
            mpp_err("Warning: Did not find the right long term reference picture or more than one.");
            return;
        } else if (ref_idx != 0) {
            refPicListModification->m_refPicListModificationFlagL0 = 1;
            calc_ref_pic_set_idxl0(dpb, slice, ref_idx);
        }
    }
    refPicListModification->m_refPicListModificationFlagL1 = 0;
    h265e_dbg_func("leave\n");
}